

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::GetKeyName(ImGuiKey key)

{
  uint uVar1;
  uint uVar2;
  
  if (key == ImGuiKey_KeysData_OFFSET) {
    return "None";
  }
  if ((key < ImGuiKey_NamedKey_BEGIN) &&
     (key = (GImGui->IO).KeyMap[key], key == ~ImGuiKey_KeysData_OFFSET)) {
    return "N/A";
  }
  if ((key & ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) {
    uVar2 = key - ImGuiKey_NamedKey_BEGIN;
    if (0x99 < uVar2) {
      return "Unknown";
    }
  }
  else {
    uVar2 = key - ImGuiKey_ModCtrl >> 0xc;
    uVar1 = key << 0x14 | uVar2;
    if (7 < uVar1) {
      return "Unknown";
    }
    if ((0x8bU >> (uVar2 & 0x1f) & 1) == 0) {
      return "Unknown";
    }
    uVar2 = *(uint *)(&DAT_001f6910 + (ulong)uVar1 * 4);
  }
  return _ZL9GKeyNames_rel + *(int *)(_ZL9GKeyNames_rel + (ulong)uVar2 * 4);
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
    if (key == ImGuiKey_None)
        return "None";
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(IsNamedKeyOrMod(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    ImGuiContext& g = *GImGui;
    if (IsLegacyKey(key))
    {
        if (g.IO.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)g.IO.KeyMap[key]));
        key = (ImGuiKey)g.IO.KeyMap[key];
    }
#endif
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}